

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcElectricalCircuit::~IfcElectricalCircuit
          (IfcElectricalCircuit *this,void **vtt)

{
  void **vtt_local;
  IfcElectricalCircuit *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcElectricalCircuit,_0UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcElectricalCircuit,_0UL> *)
             &(this->super_IfcSystem).super_IfcGroup.field_0xf0,vtt + 0x1f);
  IfcSystem::~IfcSystem(&this->super_IfcSystem,vtt + 1);
  return;
}

Assistant:

IfcElectricalCircuit() : Object("IfcElectricalCircuit") {}